

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O3

void __thiscall Control::apply(Control *this,Network *network,int t,int tod)

{
  int iVar1;
  Node *pNVar2;
  
  iVar1 = *(int *)&(this->super_Element).field_0x2c;
  if (iVar1 == 3) {
    if (this->time == tod) goto LAB_0012b852;
  }
  else if (iVar1 == 2) {
    if (this->time == t) goto LAB_0012b852;
  }
  else if (iVar1 == 0) {
    pNVar2 = this->node;
    if (this->levelType == HI_LEVEL) {
      if (this->volume - ABS(pNVar2->outflow) <= pNVar2[1].actualDemand) goto LAB_0012b852;
    }
    else if ((this->levelType == LOW_LEVEL) &&
            (pNVar2[1].actualDemand <= ABS(pNVar2->outflow) + this->volume)) {
LAB_0012b852:
      activate(this,true,(ostream *)&network->msgLog);
      return;
    }
  }
  return;
}

Assistant:

void Control::apply(Network* network, int t, int tod)
{
    bool makeChange = true;
    Tank* tank;

    switch (type)
    {
    case PRESSURE_LEVEL: break;

    case TANK_LEVEL:
        tank = static_cast<Tank*>(node);
        // ... use tolerance of one second's worth of inflow/outflow on action level
        if ( (levelType == LOW_LEVEL && tank->volume <= volume + abs(tank->outflow) )
        ||   (levelType == HI_LEVEL && tank->volume >= volume - abs(tank->outflow)) )
        {
            activate(makeChange, network->msgLog);
        }
        break;

    case ELAPSED_TIME:
        if ( t == time ) activate(makeChange, network->msgLog);
        break;

    case TIME_OF_DAY:
        if ( tod == time ) activate(makeChange, network->msgLog);
        break;
    }
}